

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

void __thiscall
clipp::detail::action_provider<clipp::parameter>::execute_actions
          (action_provider<clipp::parameter> *this,arg_string *arg)

{
  pointer pfVar1;
  function<void_(const_char_*)> *a;
  pointer this_00;
  
  pfVar1 = (this->argActions_).
           super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->argActions_).
                 super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pfVar1; this_00 = this_00 + 1
      ) {
    std::function<void_(const_char_*)>::operator()(this_00,(arg->_M_dataplus)._M_p);
  }
  return;
}

Assistant:

void execute_actions(const arg_string& arg) const {
        int i = 0;
        for(const auto& a : argActions_) {
            ++i;
            a(arg.c_str());
        }
    }